

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O1

void __thiscall
CreateCharacterState::processInput
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  string username;
  Account account;
  shared_ptr<Connection> local_e8;
  shared_ptr<Connection> local_d8;
  shared_ptr<Connection> local_c8;
  shared_ptr<Connection> local_b8;
  shared_ptr<Connection> local_a8;
  shared_ptr<Connection> local_98;
  int local_84;
  string local_80;
  Account local_60;
  
  Connection::GetUsername_abi_cxx11_
            (&local_80,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Connection::GetAccount
            (&local_60,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_84 = Connection::GetID((connection->
                               super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_state_map,&local_84);
  switch(*pmVar1) {
  case 0:
    local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processSelectCharacter(this,input,&local_98);
    this_00._M_pi =
         local_98.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 1:
    local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processChooseRace(this,input,&local_a8);
    this_00._M_pi =
         local_a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 2:
    local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processChooseClass(this,input,&local_b8);
    this_00._M_pi =
         local_b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 3:
    local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processRollStats(this,input,&local_c8);
    this_00._M_pi =
         local_c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 4:
    local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processNameCharacter(this,input,&local_d8);
    this_00._M_pi =
         local_d8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case 5:
    local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    processConfirmCharacter(this,input,&local_e8);
    this_00._M_pi =
         local_e8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  default:
    goto switchD_0015a24c_default;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
switchD_0015a24c_default:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.m_characters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._username._M_dataplus._M_p != &local_60._username.field_2) {
    operator_delete(local_60._username._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CreateCharacterState::processInput(const std::string& input, std::shared_ptr<Connection> connection) {
    std::string username = connection->GetUsername();
    Account account = connection->GetAccount();
    int state = m_state_map[connection->GetID()];
    switch(state)
    {
        case SELECT_CHARACTER:
            processSelectCharacter(input, connection);
            break;
        case CHOOSE_RACE:
            processChooseRace(input, connection);
            break;
        case CHOOSE_CLASS:
            processChooseClass(input, connection);
            break;
        case ROLL_STATS:
            processRollStats(input, connection);
            break;
        case NAME_CHARACTER:
            processNameCharacter(input, connection);
            break;
        case CONFIRM_CHARACTER:
            processConfirmCharacter(input, connection);
            break;
        default:
            break;
    }
}